

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O0

void __thiscall
mvm::disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
parse<unsigned_int,4ul,mvm::num::little_endian_tag>
          (disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *this,
          string *instr)

{
  uint8_t *puVar1;
  bool bVar2;
  uint __val;
  mexcept *this_00;
  bytecode_serializer local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  uint8_t *local_20;
  uint8_t *ip;
  string *instr_local;
  disassembler<(anonymous_namespace)::mini_set,_mvm::bytecode_serializer> *this_local;
  
  ip = (uint8_t *)instr;
  instr_local = (string *)this;
  local_20 = rebasable_ip::operator_cast_to_unsigned_char_((rebasable_ip *)this);
  mvm::ip::operator+=((ip *)this,4);
  bVar2 = rebasable_ip::assert_in_chunk((rebasable_ip *)this);
  puVar1 = ip;
  if (!bVar2) {
    local_55 = 1;
    this_00 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"[-][mvm] bytecode overflow",&local_41);
    mexcept::mexcept(this_00,&local_40,CODE_OVERFLOW);
    local_55 = 0;
    __cxa_throw(this_00,&mexcept::typeinfo,mexcept::~mexcept);
  }
  __val = bytecode_serializer::parse<unsigned_int,4ul,mvm::num::little_endian_tag>
                    (&local_79,local_20 + 1);
  std::__cxx11::to_string(&local_78,__val);
  std::__cxx11::string::append((string *)puVar1);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void disassembler<Set, MetaCodeImpl>::parse(std::string &instr) {
  uint8_t *ip = m_rebased_ip;
  m_rebased_ip += N;

  if (!m_rebased_ip.assert_in_chunk()) {
    throw mexcept("[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW);
  }

  instr.append(
      std::to_string(code_impl_type{}.template parse<T, N, Endian>(ip + 1)));
}